

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall
Transcript::AddWeights(Transcript *this,vector<double,_std::allocator<double>_> *weights)

{
  size_type sVar1;
  length_error *this_00;
  string local_c8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  vector<double,_std::allocator<double>_> *local_18;
  vector<double,_std::allocator<double>_> *weights_local;
  Transcript *this_local;
  
  local_18 = weights;
  weights_local = (vector<double,_std::allocator<double>_> *)this;
  sVar1 = std::vector<double,_std::allocator<double>_>::size(weights);
  if (sVar1 != (long)(((this->super_Polymer).stop_ - (this->super_Polymer).start_) + 1)) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    sVar1 = std::vector<double,_std::allocator<double>_>::size(local_18);
    std::__cxx11::to_string(&local_98,sVar1);
    std::operator+(&local_78,"Provided weights not the correct size. ",&local_98);
    std::operator+(&local_58,&local_78," ");
    std::__cxx11::to_string
              (&local_c8,((this->super_Polymer).stop_ - (this->super_Polymer).start_) + 1);
    std::operator+(&local_38,&local_58,&local_c8);
    std::length_error::length_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  MobileElementManager::set_weights(&(this->super_Polymer).polymerases_,local_18);
  std::vector<double,_std::allocator<double>_>::operator=(&this->weights_,local_18);
  return;
}

Assistant:

void Transcript::AddWeights(const std::vector<double> &weights) {
  if (weights.size() != (stop_ - start_ + 1)) { //start_ should always be 1
    throw std::length_error("Provided weights not the correct size. " +
                            std::to_string(weights.size()) + " " +
                            std::to_string(stop_ - start_ + 1));
  }
  polymerases_.set_weights(weights);
  weights_ = weights;
}